

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

Symbol * __thiscall
slang::ast::anon_unknown_0::AnsiPortListBuilder::add
          (AnsiPortListBuilder *this,DeclaratorSyntax *decl,DefinitionSymbol *iface,
          string_view modport,bool isGeneric,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs)

{
  Compilation *this_00;
  Scope *this_01;
  InterfacePortSymbol *this_02;
  SourceRange sourceRange;
  SourceLocation local_48;
  string_view local_40;
  
  this_00 = this->comp;
  local_40 = parsing::Token::valueText(&decl->name);
  local_48 = parsing::Token::location(&decl->name);
  this_02 = BumpAllocator::
            emplace<slang::ast::InterfacePortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                      (&this_00->super_BumpAllocator,&local_40,&local_48);
  this_02->interfaceDef = iface;
  (this_02->modport)._M_len = modport._M_len;
  (this_02->modport)._M_str = modport._M_str;
  this_02->isGeneric = isGeneric;
  (this_02->super_Symbol).originatingSyntax = &decl->super_SyntaxNode;
  Symbol::setAttributes(&this_02->super_Symbol,this->scope,attrs);
  if (decl->initializer != (EqualsValueClauseSyntax *)0x0) {
    this_01 = this->scope;
    sourceRange = slang::syntax::SyntaxNode::sourceRange(&decl->initializer->super_SyntaxNode);
    Scope::addDiag(this_01,(DiagCode)0x10006,sourceRange);
  }
  this->lastDirection = InOut;
  this->lastType = (DataTypeSyntax *)0x0;
  this->lastNetType = (NetType *)0x0;
  this->lastInterface = iface;
  (this->lastModport)._M_len = modport._M_len;
  (this->lastModport)._M_str = modport._M_str;
  this->lastGenericIface = isGeneric;
  return &this_02->super_Symbol;
}

Assistant:

Symbol* add(const DeclaratorSyntax& decl, const DefinitionSymbol* iface,
                std::string_view modport, bool isGeneric,
                std::span<const AttributeInstanceSyntax* const> attrs) {
        auto port = comp.emplace<InterfacePortSymbol>(decl.name.valueText(), decl.name.location());
        port->interfaceDef = iface;
        port->modport = modport;
        port->isGeneric = isGeneric;
        port->setSyntax(decl);
        port->setAttributes(scope, attrs);

        if (decl.initializer)
            scope.addDiag(diag::AnsiIfacePortDefault, decl.initializer->sourceRange());

        lastDirection = ArgumentDirection::InOut;
        lastType = nullptr;
        lastNetType = nullptr;
        lastInterface = iface;
        lastModport = modport;
        lastGenericIface = isGeneric;

        return port;
    }